

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O0

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  CURLcode CVar1;
  char *pcVar2;
  CURLcode result;
  int remote_port_local;
  char *hostname_local;
  int sockindex_local;
  connectdata *conn_local;
  
  if ((conn->tunnel_state[sockindex] == TUNNEL_INIT) && (conn->connect_buffer == (char *)0x0)) {
    pcVar2 = (char *)(*Curl_cmalloc)(0x4000);
    conn->connect_buffer = pcVar2;
    if (conn->connect_buffer == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
  }
  CVar1 = CONNECT(conn,sockindex,hostname,remote_port);
  if ((CVar1 != CURLE_OK) || (conn->tunnel_state[sockindex] == TUNNEL_COMPLETE)) {
    (*Curl_cfree)(conn->connect_buffer);
    conn->connect_buffer = (char *)0x0;
  }
  return CVar1;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(TUNNEL_INIT == conn->tunnel_state[sockindex]) {
    if(!conn->connect_buffer) {
      conn->connect_buffer = malloc(CONNECT_BUFFER_SIZE);
      if(!conn->connect_buffer)
        return CURLE_OUT_OF_MEMORY;
    }
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || (TUNNEL_COMPLETE == conn->tunnel_state[sockindex]))
    Curl_safefree(conn->connect_buffer);

  return result;
}